

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O0

RK_S32 user_data_registered_itu_t_t35(HEVCContext *s,BitReadCtx_t *gb,int size)

{
  BitReadCtx_t *pBVar1;
  BitReadCtx_t *pBVar2;
  MPP_RET MVar3;
  RK_S32 RVar4;
  char local_44 [5];
  undefined1 local_3f;
  undefined2 local_3e;
  RK_S32 _out_3;
  RK_U8 application_identifier;
  RK_U8 smpte2094_40_application_identifier;
  RK_U16 smpte2094_40_provider_oriented_code;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  uint uStack_28;
  RK_U16 provider_oriented_code;
  RK_S32 provider_code;
  RK_S32 country_code;
  int size_local;
  BitReadCtx_t *gb_local;
  HEVCContext *s_local;
  
  if (size < 3) {
    return 0;
  }
  provider_code = size;
  _country_code = gb;
  gb_local = (BitReadCtx_t *)s;
  MVar3 = mpp_read_bits(gb,8,&_out_2);
  _country_code->ret = MVar3;
  if (_country_code->ret == MPP_OK) {
    uStack_28 = _out_2;
    if (_out_2 == 0xff) {
      if (provider_code < 1) {
        return 0;
      }
      MVar3 = mpp_skip_longbits(_country_code,8);
      _country_code->ret = MVar3;
      if (_country_code->ret != MPP_OK) {
        return -0x3ec;
      }
    }
    if ((uStack_28 != 0xb5) && (uStack_28 != 0x26)) {
      _mpp_log_l(4,"h265d_sei",
                 "Unsupported User Data Registered ITU-T T35 SEI message (country_code = %d)",
                 (char *)0x0,(ulong)uStack_28);
      return -0x3ec;
    }
    MVar3 = mpp_read_bits(_country_code,0x10,(RK_S32 *)&application_identifier);
    _country_code->ret = MVar3;
    if (_country_code->ret == MPP_OK) {
      _out = _application_identifier;
      MVar3 = mpp_read_bits(_country_code,0x10,&_out_3);
      _country_code->ret = MVar3;
      if (_country_code->ret == MPP_OK) {
        _out_1._2_2_ = (short)_out_3;
        if ((h265d_debug & 0x20) != 0) {
          _mpp_log_l(4,"h265d_sei","country_code=%d provider_code=%d terminal_provider_code %d\n",
                     (char *)0x0,(ulong)uStack_28,(ulong)(uint)_out,_out_3 & 0xffff);
        }
        pBVar2 = gb_local;
        pBVar1 = _country_code;
        if (_out == 4) {
          RVar4 = mpp_get_bits_left(_country_code);
          vivid_display_info((HEVCContext *)pBVar2,pBVar1,RVar4 >> 3);
        }
        else if (_out == 0x3c) {
          local_3e = 1;
          local_3f = 4;
          MVar3 = mpp_read_bits(_country_code,8,(RK_S32 *)local_44);
          pBVar2 = gb_local;
          pBVar1 = _country_code;
          _country_code->ret = MVar3;
          if (_country_code->ret != MPP_OK) {
            return -0x3ec;
          }
          if ((_out_1._2_2_ == 1) && (local_44[0] == '\x04')) {
            RVar4 = mpp_get_bits_left(_country_code);
            hdr10plus_dynamic_data((HEVCContext *)pBVar2,pBVar1,RVar4 >> 3);
          }
        }
        return 0;
      }
    }
  }
  return -0x3ec;
}

Assistant:

static RK_S32 user_data_registered_itu_t_t35(HEVCContext *s, BitReadCtx_t *gb, int size)
{
    RK_S32 country_code, provider_code;
    RK_U16 provider_oriented_code;

    if (size < 3)
        return 0;

    READ_BITS(gb, 8, &country_code);
    if (country_code == 0xFF) {
        if (size < 1)
            return 0;

        SKIP_BITS(gb, 8);
    }

    /* usa country_code or china country_code */
    if (country_code != 0xB5 && country_code != 0x26) {
        mpp_log("Unsupported User Data Registered ITU-T T35 SEI message (country_code = %d)", country_code);
        return MPP_ERR_STREAM;
    }

    READ_BITS(gb, 16, &provider_code);
    READ_BITS(gb, 16, &provider_oriented_code);
    h265d_dbg(H265D_DBG_SEI, "country_code=%d provider_code=%d terminal_provider_code %d\n",
              country_code, provider_code, provider_oriented_code);
    switch (provider_code) {
    case 0x4: {/* cuva provider_code is 0x4 */
        vivid_display_info(s, gb, mpp_get_bits_left(gb) >> 3);
    } break;
    case 0x3c: {/* smpte2094_40 provider_code is 0x3c*/
        const RK_U16 smpte2094_40_provider_oriented_code = 0x0001;
        const RK_U8 smpte2094_40_application_identifier = 0x04;
        RK_U8 application_identifier;

        READ_BITS(gb, 8, &application_identifier);
        /* hdr10plus priverder_oriented_code is 0x0001, application_identifier is 0x04 */
        if (provider_oriented_code == smpte2094_40_provider_oriented_code &&
            application_identifier == smpte2094_40_application_identifier)
            hdr10plus_dynamic_data(s, gb, mpp_get_bits_left(gb) >> 3);
    } break;
    default:
        break;
    }

    return 0;

__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}